

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O2

void __thiscall
Ratio::addAllEEdges(Ratio *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges)

{
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *this_00;
  pointer pPVar1;
  PhyloTreeEdge *e;
  pointer __x;
  double dVar2;
  
  this_00 = &this->eEdges;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
            (this_00,((long)(this->eEdges).
                            super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->eEdges).
                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
                           .super__Vector_impl_data._M_start) / 0x48 +
                     ((long)(edges->
                            super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x48);
  pPVar1 = (edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_start; __x != pPVar1; __x = __x + 1) {
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(this_00,__x);
  }
  dVar2 = geoAvg(this_00);
  this->eLength = dVar2;
  return;
}

Assistant:

void Ratio::addAllEEdges(vector<PhyloTreeEdge>& edges) {
    eEdges.reserve(eEdges.size() + edges.size());
    for (auto &e : edges) {
        eEdges.push_back(e);
    }
    eLength = geoAvg(eEdges);
}